

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateSolutionVectorLright
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *change,int j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,int *nnz)

{
  type_conflict5 tVar1;
  uint in_EDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  self_type *in_R9;
  
  tVar1 = boost::multiprecision::operator==(in_RSI,(double *)0x39a18d);
  if (tVar1) {
    (in_R8->m_backend).data._M_elems[(int)(in_R9->m_backend).data._M_elems[0]] = in_EDX;
    (in_R9->m_backend).data._M_elems[0] = (in_R9->m_backend).data._M_elems[0] + 1;
  }
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator-=(in_R8,in_R9);
  tVar1 = boost::multiprecision::operator==(in_RSI,(double *)0x39a1d9);
  if (tVar1) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)idx,(double)nnz);
  }
  return;
}

Assistant:

void inline CLUFactor<R>::updateSolutionVectorLright(R change, int j, R& vec, int* idx, int& nnz)
{
   // create a new entry in #ridx
   if(vec == 0.0)
   {
      assert(nnz < thedim);
      idx[nnz] = j;
      ++nnz;
   }

   vec -= change;

   // mark the entry where exact eliminiation occurred
   if(vec == 0.0)
      vec = SOPLEX_FACTOR_MARKER;
}